

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OSTEI_Writer.cpp
# Opt level: O0

void __thiscall OSTEI_Writer::Write_Permutations_(OSTEI_Writer *this)

{
  GeneratorInfoBase *in_RDI;
  QAM am;
  undefined1 in_stack_000005d6;
  undefined1 in_stack_000005d7;
  QAM *in_stack_000005d8;
  OSTEI_Writer *in_stack_000005e0;
  QAM *this_00;
  QAM local_38;
  
  this_00 = &local_38;
  GeneratorInfoBase::FinalAM(in_RDI);
  QAM::QAM(this_00,(QAM *)in_RDI);
  Write_Permute_(in_stack_000005e0,in_stack_000005d8,(bool)in_stack_000005d7,(bool)in_stack_000005d6
                );
  QAM::~QAM((QAM *)0x15dfdc);
  QAM::QAM(this_00,(QAM *)in_RDI);
  Write_Permute_(in_stack_000005e0,in_stack_000005d8,(bool)in_stack_000005d7,(bool)in_stack_000005d6
                );
  QAM::~QAM((QAM *)0x15e011);
  QAM::QAM(this_00,(QAM *)in_RDI);
  Write_Permute_(in_stack_000005e0,in_stack_000005d8,(bool)in_stack_000005d7,(bool)in_stack_000005d6
                );
  QAM::~QAM((QAM *)0x15e046);
  QAM::~QAM((QAM *)0x15e053);
  return;
}

Assistant:

void OSTEI_Writer::Write_Permutations_(void) const
{
    ///////////////////////////////////////////////////////////
    // Note that we never permute bra, ket. That would
    // affect vectorization since we only vectorize on the ket
    ///////////////////////////////////////////////////////////
    QAM am = info_.FinalAM();

    // permute 1,2
    Write_Permute_(am, true, false);

    // permute 3,4
    Write_Permute_(am, false, true);

    // permute 1,2 and 3,4
    Write_Permute_(am, true, true);
}